

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void cmCursesMainForm::UpdateProgress(char *msg,float prog,void *vp)

{
  int local_43c;
  char **local_430;
  char *cmsg;
  char tmp [1024];
  cmCursesMainForm *cm;
  void *vp_local;
  float prog_local;
  char *msg_local;
  
  if (vp != (void *)0x0) {
    local_430 = (char **)msg;
    tmp._1016_8_ = vp;
    if (0.0 <= prog) {
      sprintf((char *)&cmsg,"%s %i%%",msg,(ulong)(uint)(int)(prog * 100.0));
      local_430 = &cmsg;
    }
    (**(code **)(*(long *)tmp._1016_8_ + 0x30))(tmp._1016_8_,local_430);
    PrintKeys((cmCursesMainForm *)tmp._1016_8_,1);
    curses_move(1,1);
    if (_stdscr == 0) {
      local_43c = -1;
    }
    else {
      local_43c = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,local_43c,1);
    refresh();
  }
  return;
}

Assistant:

void cmCursesMainForm::UpdateProgress(const char *msg, float prog, void* vp)
{
  cmCursesMainForm* cm = static_cast<cmCursesMainForm*>(vp);
  if ( !cm )
    {
    return;
    }
  char tmp[1024];
  const char *cmsg = tmp;
  if ( prog >= 0 )
    {
    sprintf(tmp, "%s %i%%",msg,(int)(100*prog));
    }
  else
    {
    cmsg = msg;
    }
  cm->UpdateStatusBar(cmsg);
  cm->PrintKeys(1);
  curses_move(1,1);
  touchwin(stdscr);
  refresh();
}